

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Scanner::scan_ns_uri_char(Scanner *this)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  StringRef Chars;
  StringRef local_30;
  
  local_30.Data = this->Current;
  pbVar3 = (byte *)this->End;
  if ((byte *)local_30.Data != pbVar3) {
    do {
      if (((((*local_30.Data != 0x25) || (pbVar3 <= (byte *)local_30.Data + 2)) ||
           ((9 < (byte)(((byte *)local_30.Data)[1] - 0x30) &&
            (0x19 < (byte)((((byte *)local_30.Data)[1] & 0xdf) + 0xbf))))) ||
          ((bVar1 = ((byte *)local_30.Data)[2], 9 < (byte)(bVar1 - 0x30) &&
           (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))) &&
         ((*local_30.Data != 0x2d && (0x19 < (byte)((*local_30.Data & 0xdfU) + 0xbf))))) {
        local_30.Length = 1;
        Chars.Length = 0x15;
        Chars.Data = "#;/?:@&=+$,_.!~*\'()[]";
        sVar2 = StringRef::find_first_of(&local_30,Chars,0);
        if (sVar2 == 0xffffffffffffffff) {
          return;
        }
      }
      pbVar3 = (byte *)this->End;
      local_30.Data = this->Current + 1;
      this->Current = local_30.Data;
      this->Column = this->Column + 1;
    } while ((byte *)local_30.Data != pbVar3);
  }
  return;
}

Assistant:

void Scanner::scan_ns_uri_char() {
  while (true) {
    if (Current == End)
      break;
    if ((   *Current == '%'
          && Current + 2 < End
          && is_ns_hex_digit(*(Current + 1))
          && is_ns_hex_digit(*(Current + 2)))
        || is_ns_word_char(*Current)
        || StringRef(Current, 1).find_first_of("#;/?:@&=+$,_.!~*'()[]")
          != StringRef::npos) {
      ++Current;
      ++Column;
    } else
      break;
  }
}